

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vpmadd52luq(PDISASM pMyDisasm)

{
  undefined4 uVar1;
  long lVar2;
  
  if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01'))
     && ((pMyDisasm->Reserved_).EVEX.W == '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmadd52luq",0xc);
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    ArgsVEX(pMyDisasm);
    uVar1 = 3;
    lVar2 = 0x1c8;
  }
  else {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    uVar1 = 0xffffffff;
    lVar2 = 0x924;
  }
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar2 + -0x14) = uVar1;
  return;
}

Assistant:

void __bea_callspec__ vpmadd52luq(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmadd52luq");
        #endif
        GV.EVEX.tupletype = FULL;
        ArgsVEX(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}